

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtooltip.cpp
# Opt level: O0

void __thiscall QTipLabel::restartExpireTimer(QTipLabel *this,int msecDisplayTime)

{
  bool bVar1;
  QObject *pQVar2;
  QBasicTimer *in_RDI;
  long in_FS_OFFSET;
  qsizetype time;
  qsizetype textLength;
  QLabelPrivate *d;
  QLabel *in_stack_ffffffffffffff78;
  QObject *obj;
  undefined6 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff96;
  byte bVar3;
  undefined1 in_stack_ffffffffffffff97;
  byte bVar4;
  QObject *local_48;
  int local_3c;
  QString local_38;
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QLabel::d_func((QLabel *)0x4c0274);
  bVar1 = QLabelPrivate::needTextControl
                    ((QLabelPrivate *)
                     CONCAT17(in_stack_ffffffffffffff97,
                              CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)));
  bVar4 = 0;
  bVar3 = 0;
  if (bVar1) {
    QWidgetTextControl::toPlainText((QWidgetTextControl *)in_stack_ffffffffffffff78);
    bVar4 = 1;
    pQVar2 = (QObject *)QString::size(&local_20);
  }
  else {
    QLabel::text(in_stack_ffffffffffffff78);
    bVar3 = 1;
    pQVar2 = (QObject *)QString::size(&local_38);
  }
  obj = pQVar2;
  if ((bVar3 & 1) != 0) {
    QString::~QString((QString *)0x4c02ff);
  }
  if ((bVar4 & 1) != 0) {
    QString::~QString((QString *)0x4c0312);
  }
  local_3c = 0;
  local_48 = pQVar2 + -100;
  qMax<int,long_long>(&local_3c,(longlong *)&local_48);
  QBasicTimer::start(in_RDI,(int)((ulong)pQVar2 >> 0x20),obj);
  QBasicTimer::stop();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTipLabel::restartExpireTimer(int msecDisplayTime)
{
    Q_D(const QLabel);
    const qsizetype textLength = d->needTextControl() ? d->control->toPlainText().size() : text().size();
    qsizetype time = 10000 + 40 * qMax(0, textLength - 100);
    if (msecDisplayTime > 0)
        time = msecDisplayTime;
    expireTimer.start(time, this);
    hideTimer.stop();
}